

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[6],std::__cxx11::string&,char_const&,char_const(&)[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
                   (string *__return_storage_ptr__,char (*arg) [6],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,char (*args_2) [2],char *args_3,char (*args_4) [2],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  string local_70;
  string local_50;
  
  StringBuilder_abi_cxx11_(&local_50,*arg);
  StringBuilder<std::__cxx11::string,char_const&,char_const(&)[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
            (&local_70,args,args_1,args_2,args_3,args_4,args_5);
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}